

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall IR::Instr::TransfersSrcValue(Instr *this)

{
  bool bVar1;
  
  if (this->m_dst == (Opnd *)0x0) {
    return false;
  }
  if ((((this->m_src2 == (Opnd *)0x0) || (bVar1 = OpCodeAttr::NonIntTransfer(this->m_opcode), bVar1)
       ) && (bVar1 = OpCodeAttr::DoNotTransfer(this->m_opcode), !bVar1)) &&
     (bVar1 = CallsGetter(this), !bVar1)) {
    bVar1 = CallsSetter(this);
    return !bVar1;
  }
  return false;
}

Assistant:

bool Instr::TransfersSrcValue()
{
    // Return whether the instruction transfers a value to the destination.
    // This is used to determine whether we should generate a value for the src so that it will
    // match with the dst for copy prop.

    // No point creating an unknown value for the src of a binary instr, as the dst will just be a different
    // Don't create value for instruction without dst as well. The value doesn't go anywhere.

    // Consider: Add opcode attribute to indicate whether the opcode would use the value or not

    return
        this->GetDst() != nullptr &&

        // The lack of a Src2 does not always indicate that the instr is not a transfer instr (ex: StSlotChkUndecl).
        (this->GetSrc2() == nullptr || OpCodeAttr::NonIntTransfer(this->m_opcode)) &&

        !OpCodeAttr::DoNotTransfer(this->m_opcode) &&
        !this->CallsAccessor();
}